

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_int clEnqueueTask(cl_command_queue command_queue,cl_kernel kernel,cl_uint num_events_in_wait_list
                    ,cl_event *event_wait_list,cl_event *event)

{
  CTracker *pCVar1;
  CLIntercept *this;
  bool bVar2;
  byte bVar3;
  cl_int errorCode;
  cl_int errorCode_00;
  uint64_t enqueueCounter;
  time_point tVar4;
  time_point tVar5;
  string eventWaitListString;
  cl_event local_event;
  string hostTag;
  string deviceTag;
  string local_b0;
  time_point local_90;
  time_point local_88;
  undefined8 local_80;
  cl_event local_78;
  string local_70;
  string local_50;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x24;
  }
  if ((g_pIntercept->m_Dispatch).clEnqueueTask == (cl_api_clEnqueueTask)0x0) {
    return -0x24;
  }
  enqueueCounter = CLIntercept::incrementEnqueueCounter(g_pIntercept);
  if (((((this->m_Config).AubCapture == true) &&
       ((this->m_Config).AubCaptureMinEnqueue <= enqueueCounter)) &&
      (enqueueCounter <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     (bVar2 = CLIntercept::checkAubCaptureKernelSignature(this,kernel,0,(size_t *)0x0,(size_t *)0x0)
     , bVar2)) {
    CLIntercept::startAubCapture
              (this,"clEnqueueTask",enqueueCounter,kernel,0,(size_t *)0x0,(size_t *)0x0,
               command_queue);
  }
  errorCode = 0;
  if ((this->m_Config).NullEnqueue != false) goto LAB_00123967;
  getFormattedEventWaitList_abi_cxx11_(&local_b0,this,num_events_in_wait_list,event_wait_list);
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (this,"clEnqueueTask",enqueueCounter,kernel,"queue = %p, kernel = %p%s",command_queue,
               kernel,local_b0._M_dataplus._M_p);
  }
  if ((this->m_Config).EventChecking == true) {
    CLIntercept::checkEventList(this,"clEnqueueTask",num_events_in_wait_list,event_wait_list,event);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if ((((this->m_Config).ChromeCallLogging != false) ||
      ((((this->m_Config).HostPerformanceTiming == true &&
        ((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter)) &&
       (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) ||
     ((((bVar3 = (this->m_Config).DevicePerformanceTiming, (bool)bVar3 != false ||
        ((this->m_Config).ITTPerformanceTiming != false)) ||
       (((this->m_Config).ChromePerformanceTiming != false ||
        ((this->m_Config).DevicePerfCounterEventBasedSampling == true)))) &&
      (((this->m_Config).DevicePerformanceTimingMinEnqueue <= enqueueCounter &&
       (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)))))) {
    CLIntercept::getTimingTagsKernel
              (this,command_queue,kernel,0,(size_t *)0x0,(size_t *)0x0,(size_t *)0x0,&local_70,
               &local_50);
    bVar3 = (this->m_Config).DevicePerformanceTiming;
  }
  local_78 = (cl_event)0x0;
  if (((((bVar3 & 1) == 0) && ((this->m_Config).ITTPerformanceTiming == false)) &&
      ((this->m_Config).ChromePerformanceTiming == false)) &&
     ((this->m_Config).DevicePerfCounterEventBasedSampling != true)) {
    local_88.__d.__r = (duration)0;
    local_80 = 0;
  }
  else {
    local_88.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_80 = CONCAT71((int7)((ulong)local_88.__d.__r >> 8),event == (cl_event *)0x0);
    if (event == (cl_event *)0x0) {
      event = &local_78;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_90.__d.__r = (duration)0;
  }
  else {
    local_90.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*(this->m_Dispatch).clEnqueueTask)
                        (command_queue,kernel,num_events_in_wait_list,event_wait_list,event);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    tVar4.__d.__r = (duration)0;
  }
  else {
    tVar4.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      CLIntercept::updateHostTimingStats(this,"clEnqueueTask",&local_70,local_90,tVar4);
    }
  }
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     ((this->m_Config).ChromePerformanceTiming == false)) {
    if ((event != (cl_event *)0x0) &&
       ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_001237c4:
      if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= enqueueCounter) &&
         (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
        CLIntercept::addTimingEvent
                  (this,"clEnqueueTask",enqueueCounter,local_88,&local_50,command_queue,*event);
      }
      if ((char)local_80 != '\0') {
        (*(this->m_Dispatch).clReleaseEvent)(*event);
        goto LAB_00123820;
      }
    }
  }
  else {
    if (event != (cl_event *)0x0) goto LAB_001237c4;
LAB_00123820:
    event = (cl_event *)0x0;
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar3 = (this->m_Config).ErrorAssert;
    if ((bool)bVar3 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_00123887;
    }
    else if (errorCode == 0) goto LAB_0012385a;
LAB_0012386c:
    if ((bVar3 & 1) != 0) {
      raise(5);
    }
    if ((this->m_Config).NoErrors != false) {
      errorCode = 0;
    }
  }
  else {
    if (errorCode != 0) {
      CLIntercept::logError(this,"clEnqueueTask",errorCode);
      bVar3 = (this->m_Config).ErrorAssert;
      goto LAB_0012386c;
    }
LAB_0012385a:
    errorCode = 0;
  }
LAB_00123887:
  if (((event != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
     (*event != (cl_event)0x0)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Events;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit(this,"clEnqueueTask",errorCode,event,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    CLIntercept::chromeCallLoggingExit
              (this,"clEnqueueTask",&local_70,true,enqueueCounter,local_90,tVar4);
  }
  if (((event != (cl_event *)0x0) && (*event != (cl_event)0x0)) &&
     (((this->m_Config).ChromeCallLogging != false ||
      ((this->m_Config).ChromePerformanceTiming == true)))) {
    CLIntercept::addEvent(this,*event,enqueueCounter);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
LAB_00123967:
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar4.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar4.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueTask");
    errorCode_00 = (*(this->m_Dispatch).clFinish)(command_queue);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd(this,"clFinish","clEnqueueTask",errorCode_00);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar5.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
        CLIntercept::updateHostTimingStats(this,"(finish after enqueue)",&local_b0,tVar4,tVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",&local_b0,false,0,tVar4,tVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar4.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar4.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar5.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
        CLIntercept::updateHostTimingStats(this,"(device timing overhead)",&local_b0,tVar4,tVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",&local_b0,false,0,tVar4,tVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(command_queue);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (enqueueCounter < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < enqueueCounter)))) {
    CLIntercept::stopAubCapture(this,command_queue);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clEnqueueTask)(
    cl_command_queue command_queue,
    cl_kernel kernel,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueTask )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_AUBCAPTURE_START_KERNEL( kernel, 0, NULL, NULL, command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            const std::string eventWaitListString = getFormattedEventWaitList(
                pIntercept,
                num_events_in_wait_list,
                event_wait_list);

            CALL_LOGGING_ENTER_KERNEL(
                kernel,
                "queue = %p, kernel = %p%s",
                command_queue,
                kernel,
                eventWaitListString.c_str());
            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            GET_TIMING_TAGS_KERNEL( command_queue, kernel, 0, NULL, NULL, NULL );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

            retVal = pIntercept->dispatch().clEnqueueTask(
                command_queue,
                kernel,
                num_events_in_wait_list,
                event_wait_list,
                event );

            HOST_PERFORMANCE_TIMING_END_WITH_TAG();
            DEVICE_PERFORMANCE_TIMING_END_WITH_TAG( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT_WITH_TAG( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
        CHECK_AUBCAPTURE_STOP( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}